

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writesrc.cpp
# Opt level: O0

void usrc_writeUTrie2Arrays
               (FILE *f,char *indexPrefix,char *data32Prefix,UTrie2 *pTrie,char *postfix)

{
  char *postfix_local;
  UTrie2 *pTrie_local;
  char *data32Prefix_local;
  char *indexPrefix_local;
  FILE *f_local;
  
  if (pTrie->data32 == (uint32_t *)0x0) {
    usrc_writeArray(f,indexPrefix,pTrie->index,0x10,pTrie->indexLength + pTrie->dataLength,postfix);
  }
  else {
    usrc_writeArray(f,indexPrefix,pTrie->index,0x10,pTrie->indexLength,postfix);
    usrc_writeArray(f,data32Prefix,pTrie->data32,0x20,pTrie->dataLength,postfix);
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
usrc_writeUTrie2Arrays(FILE *f,
                       const char *indexPrefix, const char *data32Prefix,
                       const UTrie2 *pTrie,
                       const char *postfix) {
    if(pTrie->data32==NULL) {
        /* 16-bit trie */
        usrc_writeArray(f, indexPrefix, pTrie->index, 16, pTrie->indexLength+pTrie->dataLength, postfix);
    } else {
        /* 32-bit trie */
        usrc_writeArray(f, indexPrefix, pTrie->index, 16, pTrie->indexLength, postfix);
        usrc_writeArray(f, data32Prefix, pTrie->data32, 32, pTrie->dataLength, postfix);
    }
}